

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeesPdu.cpp
# Opt level: O0

bool __thiscall DIS::SeesPdu::operator==(SeesPdu *this,SeesPdu *rhs)

{
  bool bVar1;
  size_type sVar2;
  const_reference this_00;
  const_reference rhs_00;
  const_reference this_01;
  const_reference rhs_01;
  ulong local_30;
  size_t idx_1;
  size_t idx;
  bool ivarsEqual;
  SeesPdu *rhs_local;
  SeesPdu *this_local;
  
  idx._7_1_ = DistributedEmissionsFamilyPdu::operator==
                        (&this->super_DistributedEmissionsFamilyPdu,
                         &rhs->super_DistributedEmissionsFamilyPdu);
  bVar1 = EntityID::operator==(&this->_orginatingEntityID,&rhs->_orginatingEntityID);
  if (!bVar1) {
    idx._7_1_ = false;
  }
  if (this->_infraredSignatureRepresentationIndex != rhs->_infraredSignatureRepresentationIndex) {
    idx._7_1_ = false;
  }
  if (this->_acousticSignatureRepresentationIndex != rhs->_acousticSignatureRepresentationIndex) {
    idx._7_1_ = false;
  }
  if (this->_radarCrossSectionSignatureRepresentationIndex !=
      rhs->_radarCrossSectionSignatureRepresentationIndex) {
    idx._7_1_ = false;
  }
  idx_1 = 0;
  while( true ) {
    sVar2 = std::vector<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>::size
                      (&this->_propulsionSystemData);
    if (sVar2 <= idx_1) break;
    this_00 = std::vector<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>::
              operator[](&this->_propulsionSystemData,idx_1);
    rhs_00 = std::vector<DIS::PropulsionSystemData,_std::allocator<DIS::PropulsionSystemData>_>::
             operator[](&rhs->_propulsionSystemData,idx_1);
    bVar1 = PropulsionSystemData::operator==(this_00,rhs_00);
    if (!bVar1) {
      idx._7_1_ = false;
    }
    idx_1 = idx_1 + 1;
  }
  local_30 = 0;
  while( true ) {
    sVar2 = std::vector<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>::
            size(&this->_vectoringSystemData);
    if (sVar2 <= local_30) break;
    this_01 = std::vector<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>::
              operator[](&this->_vectoringSystemData,local_30);
    rhs_01 = std::vector<DIS::VectoringNozzleSystem,_std::allocator<DIS::VectoringNozzleSystem>_>::
             operator[](&rhs->_vectoringSystemData,local_30);
    bVar1 = VectoringNozzleSystem::operator==(this_01,rhs_01);
    if (!bVar1) {
      idx._7_1_ = false;
    }
    local_30 = local_30 + 1;
  }
  return idx._7_1_;
}

Assistant:

bool SeesPdu::operator ==(const SeesPdu& rhs) const
 {
     bool ivarsEqual = true;

     ivarsEqual = DistributedEmissionsFamilyPdu::operator==(rhs);

     if( ! (_orginatingEntityID == rhs._orginatingEntityID) ) ivarsEqual = false;
     if( ! (_infraredSignatureRepresentationIndex == rhs._infraredSignatureRepresentationIndex) ) ivarsEqual = false;
     if( ! (_acousticSignatureRepresentationIndex == rhs._acousticSignatureRepresentationIndex) ) ivarsEqual = false;
     if( ! (_radarCrossSectionSignatureRepresentationIndex == rhs._radarCrossSectionSignatureRepresentationIndex) ) ivarsEqual = false;

     for(size_t idx = 0; idx < _propulsionSystemData.size(); idx++)
     {
        if( ! ( _propulsionSystemData[idx] == rhs._propulsionSystemData[idx]) ) ivarsEqual = false;
     }


     for(size_t idx = 0; idx < _vectoringSystemData.size(); idx++)
     {
        if( ! ( _vectoringSystemData[idx] == rhs._vectoringSystemData[idx]) ) ivarsEqual = false;
     }


    return ivarsEqual;
 }